

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void prf_state_matrix_mult_right(prf_state_t *state,matrix4x4_f32_t *m)

{
  float32_t *pfVar1;
  matrix4x4_f32_t *paafVar2;
  float32_t *pfVar3;
  long lVar4;
  long lVar5;
  float32_t *pfVar6;
  long lVar7;
  float fVar8;
  float32_t fStack_48;
  float32_t fStack_44;
  matrix4x4_f32_t copy;
  
  paafVar2 = state->matrix[state->state_push_level];
  pfVar3 = &fStack_48;
  copy[2]._8_8_ = *(undefined8 *)(*paafVar2)[3];
  copy[3]._0_8_ = *(undefined8 *)((*paafVar2)[3] + 2);
  copy[1]._8_8_ = *(undefined8 *)(*paafVar2)[2];
  copy[2]._0_8_ = *(undefined8 *)((*paafVar2)[2] + 2);
  copy[0]._8_8_ = *(undefined8 *)(*paafVar2)[1];
  copy[1]._0_8_ = *(undefined8 *)((*paafVar2)[1] + 2);
  fStack_48 = (*paafVar2)[0][0];
  fStack_44 = (*paafVar2)[0][1];
  copy[0][0] = (*paafVar2)[0][2];
  copy[0][1] = (*paafVar2)[0][3];
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pfVar6 = (float32_t *)m;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      pfVar1 = (*paafVar2)[lVar4] + lVar7;
      *pfVar1 = 0.0;
      fVar8 = 0.0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        fVar8 = fVar8 + *(float *)((long)pfVar3 + lVar5) * (float)pfVar6[lVar5];
        *pfVar1 = (float32_t)fVar8;
      }
      pfVar6 = pfVar6 + 1;
    }
    pfVar3 = pfVar3 + 4;
  }
  state->inv_dirty = 1;
  return;
}

Assistant:

void
prf_state_matrix_mult_right(
    prf_state_t * state,
    matrix4x4_f32_t * m )
{
    matrix4x4_f32_t copy;
    matrix4x4_f32_t * matrix;
    int i, j, n;

    assert( state != NULL && m != NULL );

    matrix = state->matrix[ state->state_push_level ];
    memcpy( &copy, matrix, sizeof( matrix4x4_f32_t ) );

    /* right-multiplication of matrix */
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 4; j++ ) {
            (*matrix)[i][j] = 0.0f;
            for ( n = 0; n < 4; n++ )
                (*matrix)[i][j] += copy[i][n] * (*m)[n][j];
        }
    }
    state->inv_dirty = TRUE;

}